

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::lower_upper_bound_dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this)

{
  bool bVar1;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>
  *pSVar2;
  int iVar3;
  int iVar4;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  local_70;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  local_58;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  local_40;
  
  this->dimension_to_be_lowered_ = false;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  ::Simplex_tree_complex_simplex_iterator(&local_58,this);
  local_40.sib_ = (Siblings *)0x0;
  local_40.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  local_70.sib_ = local_58.sib_;
  local_70.st_ = local_58.st_;
  local_70.sh_.m_iit.members_.nodeptr_ = local_58.sh_.m_iit.members_.nodeptr_;
  local_40.sh_.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
          )0x0;
  bVar1 = Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
          ::equal(&local_70,&local_40);
  iVar4 = -1;
  if (!bVar1) {
    do {
      local_58.sh_.m_iit.members_.nodeptr_ = local_70.sh_.m_iit.members_.nodeptr_;
      pSVar2 = self_siblings<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                         (this,&local_58.sh_);
      iVar3 = -1;
      for (; pSVar2 != (Siblings *)0x0; pSVar2 = pSVar2->oncles_) {
        iVar3 = iVar3 + 1;
      }
      if (this->dimension_ <= iVar3) {
        return false;
      }
      if (iVar4 <= iVar3) {
        iVar4 = iVar3;
      }
      Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
      ::increment(&local_70);
      bVar1 = Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
              ::equal(&local_70,&local_40);
    } while (!bVar1);
  }
  this->dimension_ = iVar4;
  return true;
}

Assistant:

bool lower_upper_bound_dimension() const {
    // reset automatic detection to recompute
    dimension_to_be_lowered_ = false;
    int new_dimension = -1;
    // Browse the tree from the left to the right as higher dimension cells are more likely on the left part of the tree
    for (Simplex_handle sh : complex_simplex_range()) {
#ifdef DEBUG_TRACES
      for (auto vertex : simplex_vertex_range(sh)) {
        std::clog << " " << vertex;
      }
      std::clog << std::endl;
#endif  // DEBUG_TRACES

      int sh_dimension = dimension(sh);
      if (sh_dimension >= dimension_)
        // Stop browsing as soon as the dimension is reached, no need to go further
        return false;
      new_dimension = (std::max)(new_dimension, sh_dimension);
    }
    dimension_ = new_dimension;
    return true;
  }